

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LU.hpp
# Opt level: O0

int OpenMD::LUFactorLinearSystem<OpenMD::SquareMatrix<double,6>>
              (SquareMatrix<double,_6> *A,int *index,int size,ElemPoinerType tmpSize)

{
  double *pdVar1;
  double *__b;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  RectMatrix<double,_6U,_6U> *in_RDI;
  RectMatrix<double,_6U,_6U> *pRVar2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar3;
  double extraout_XMM0_Qa_01;
  Real sum;
  Real temp2;
  Real temp1;
  Real largest;
  int maxI;
  int k;
  int j;
  int i;
  double local_58;
  double local_40;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  
  local_38 = 0;
  local_2c = 0;
  while( true ) {
    if (in_EDX <= (int)local_2c) {
      local_30 = 0;
      while( true ) {
        if (in_EDX <= (int)local_30) {
          return 1;
        }
        for (local_2c = 0; (int)local_2c < (int)local_30; local_2c = local_2c + 1) {
          pdVar1 = RectMatrix<double,_6U,_6U>::operator()(in_RDI,local_2c,local_30);
          local_58 = *pdVar1;
          for (local_34 = 0; (int)local_34 < (int)local_2c; local_34 = local_34 + 1) {
            pdVar1 = RectMatrix<double,_6U,_6U>::operator()(in_RDI,local_2c,local_34);
            dVar3 = *pdVar1;
            pdVar1 = RectMatrix<double,_6U,_6U>::operator()(in_RDI,local_34,local_30);
            local_58 = -dVar3 * *pdVar1 + local_58;
          }
          pdVar1 = RectMatrix<double,_6U,_6U>::operator()(in_RDI,local_2c,local_30);
          *pdVar1 = local_58;
        }
        local_40 = 0.0;
        for (local_2c = local_30; (int)local_2c < in_EDX; local_2c = local_2c + 1) {
          pdVar1 = RectMatrix<double,_6U,_6U>::operator()(in_RDI,local_2c,local_30);
          local_58 = *pdVar1;
          for (local_34 = 0; (int)local_34 < (int)local_30; local_34 = local_34 + 1) {
            pdVar1 = RectMatrix<double,_6U,_6U>::operator()(in_RDI,local_2c,local_34);
            dVar3 = *pdVar1;
            pdVar1 = RectMatrix<double,_6U,_6U>::operator()(in_RDI,local_34,local_30);
            local_58 = -dVar3 * *pdVar1 + local_58;
          }
          pRVar2 = in_RDI;
          pdVar1 = RectMatrix<double,_6U,_6U>::operator()(in_RDI,local_2c,local_30);
          *pdVar1 = local_58;
          dVar3 = *(double *)(in_RCX + (long)(int)local_2c * 8);
          std::abs((int)pRVar2);
          dVar3 = dVar3 * extraout_XMM0_Qa_00;
          if (local_40 <= dVar3) {
            local_38 = local_2c;
            local_40 = dVar3;
          }
        }
        if (local_30 != local_38) {
          for (local_34 = 0; (int)local_34 < in_EDX; local_34 = local_34 + 1) {
            pdVar1 = RectMatrix<double,_6U,_6U>::operator()(in_RDI,local_38,local_34);
            __b = RectMatrix<double,_6U,_6U>::operator()(in_RDI,local_30,local_34);
            std::swap<double>(pdVar1,__b);
          }
          *(undefined8 *)(in_RCX + (long)(int)local_38 * 8) =
               *(undefined8 *)(in_RCX + (long)(int)local_30 * 8);
        }
        *(uint *)(in_RSI + (long)(int)local_30 * 4) = local_38;
        pRVar2 = in_RDI;
        RectMatrix<double,_6U,_6U>::operator()(in_RDI,local_30,local_30);
        std::abs((int)pRVar2);
        if (extraout_XMM0_Qa_01 <= 1e-12) break;
        if (local_30 != in_EDX - 1U) {
          pdVar1 = RectMatrix<double,_6U,_6U>::operator()(in_RDI,local_30,local_30);
          dVar3 = *pdVar1;
          local_2c = local_30;
          while (local_2c = local_2c + 1, (int)local_2c < in_EDX) {
            pdVar1 = RectMatrix<double,_6U,_6U>::operator()(in_RDI,local_2c,local_30);
            *pdVar1 = (1.0 / dVar3) * *pdVar1;
          }
        }
        local_30 = local_30 + 1;
      }
      std::operator<<((ostream *)&std::cerr,"Unable to factor linear system");
      return 0;
    }
    local_40 = 0.0;
    for (local_30 = 0; (int)local_30 < in_EDX; local_30 = local_30 + 1) {
      pRVar2 = in_RDI;
      RectMatrix<double,_6U,_6U>::operator()(in_RDI,local_2c,local_30);
      std::abs((int)pRVar2);
      if (local_40 < extraout_XMM0_Qa) {
        local_40 = extraout_XMM0_Qa;
      }
    }
    if ((local_40 == 0.0) && (!NAN(local_40))) break;
    *(double *)(in_RCX + (long)(int)local_2c * 8) = 1.0 / local_40;
    local_2c = local_2c + 1;
  }
  std::operator<<((ostream *)&std::cerr,"Unable to factor linear system");
  return 0;
}

Assistant:

int LUFactorLinearSystem(MatrixType& A, int* index, int size,
                           typename MatrixType::ElemPoinerType tmpSize) {
    using Real = typename MatrixType::ElemType;

    int i, j, k;
    int maxI = 0;
    Real largest, temp1, temp2, sum;

    //
    // Loop over rows to get implicit scaling information
    //
    for (i = 0; i < size; ++i) {
      for (largest = 0.0, j = 0; j < size; ++j) {
        if ((temp2 = std::abs(A(i, j))) > largest) { largest = temp2; }
      }

      if (largest == 0.0) {
        std::cerr << "Unable to factor linear system";
        return 0;
      }
      tmpSize[i] = 1.0 / largest;
    }
    //
    // Loop over all columns using Crout's method
    //
    for (j = 0; j < size; ++j) {
      for (i = 0; i < j; ++i) {
        sum = A(i, j);
        for (k = 0; k < i; ++k) {
          sum -= A(i, k) * A(k, j);
        }
        A(i, j) = sum;
      }
      //
      // Begin search for largest pivot element
      //
      for (largest = 0.0, i = j; i < size; ++i) {
        sum = A(i, j);
        for (k = 0; k < j; ++k) {
          sum -= A(i, k) * A(k, j);
        }
        A(i, j) = sum;

        if ((temp1 = tmpSize[i] * std::abs(sum)) >= largest) {
          largest = temp1;
          maxI    = i;
        }
      }
      //
      // Check for row interchange
      //
      if (j != maxI) {
        for (k = 0; k < size; ++k) {
          std::swap(A(maxI, k), A(j, k));
        }
        tmpSize[maxI] = tmpSize[j];
      }
      //
      // Divide by pivot element and perform elimination
      //
      index[j] = maxI;

      if (std::abs(A(j, j)) <= SMALL_NUMBER) {
        std::cerr << "Unable to factor linear system";
        return false;
      }

      if (j != (size - 1)) {
        temp1 = 1.0 / A(j, j);
        for (i = j + 1; i < size; ++i) {
          A(i, j) *= temp1;
        }
      }
    }

    return 1;
  }